

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintGates(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_38;
  int fUseLibrary;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_38 = 1;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"lh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar1 = Abc_NtkHasAig(pNtk_00);
        if (iVar1 == 0) {
          Abc_NtkPrintGates(pNtk_00,local_38);
          pAbc_local._4_4_ = 0;
        }
        else {
          Abc_Print(-1,"Printing gates does not work for AIGs and sequential AIGs.\n");
          pAbc_local._4_4_ = 1;
        }
      }
      return pAbc_local._4_4_;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x6c)) break;
    local_38 = local_38 ^ 1;
  }
  Abc_Print(-2,"usage: print_gates [-lh]\n");
  Abc_Print(-2,"\t        prints statistics about gates used in the network\n");
  pcVar2 = "no";
  if (local_38 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-l    : used library gate names (if mapped) [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandPrintGates( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseLibrary;

    extern void Abc_NtkPrintGates( Abc_Ntk_t * pNtk, int fUseLibrary );

    // set defaults
    fUseLibrary = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUseLibrary ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkHasAig(pNtk) )
    {
        Abc_Print( -1, "Printing gates does not work for AIGs and sequential AIGs.\n" );
        return 1;
    }

    Abc_NtkPrintGates( pNtk, fUseLibrary );
    return 0;

usage:
    Abc_Print( -2, "usage: print_gates [-lh]\n" );
    Abc_Print( -2, "\t        prints statistics about gates used in the network\n" );
    Abc_Print( -2, "\t-l    : used library gate names (if mapped) [default = %s]\n", fUseLibrary? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}